

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::Graph::addSpecialisationParameter(Graph *this,VariableDeclaration *v)

{
  pool_ref<soul::AST::VariableDeclaration> local_20;
  
  local_20.object = v;
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
            ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
              *)&this->constants,&local_20);
  local_20.object = v;
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
  ::emplace_back<soul::pool_ref<soul::AST::ASTObject>>
            ((vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
              *)&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,
             (pool_ref<soul::AST::ASTObject> *)&local_20);
  return;
}

Assistant:

void addSpecialisationParameter (VariableDeclaration& v) override
        {
            constants.push_back (v);
            specialisationParams.push_back (v);
        }